

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::assessSmallValues
          (HighsSparseMatrix *this,HighsLogOptions *log_options,double small_matrix_value)

{
  pointer pdVar1;
  ulong uVar2;
  uint vecDim;
  double dVar3;
  double dVar4;
  string local_68;
  string local_48;
  
  pdVar1 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  vecDim = (uint)((ulong)((long)(this->value_).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
  if ((int)vecDim < 1) {
    dVar3 = INFINITY;
  }
  else {
    dVar3 = INFINITY;
    uVar2 = 0;
    do {
      dVar4 = ABS(pdVar1[uVar2]);
      if (dVar4 <= dVar3) {
        dVar3 = dVar4;
      }
      uVar2 = uVar2 + 1;
    } while ((vecDim & 0x7fffffff) != uVar2);
  }
  if (dVar3 <= small_matrix_value) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Small values in matrix","")
    ;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    analyseVectorValues(log_options,&local_48,vecDim,&this->value_,false,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::assessSmallValues(const HighsLogOptions& log_options,
                                          const double small_matrix_value) {
  double min_value = kHighsInf;
  const HighsInt num_values = this->value_.size();
  for (HighsInt iX = 0; iX < num_values; iX++)
    min_value = std::min(std::abs(this->value_[iX]), min_value);
  if (min_value > small_matrix_value) return;
  analyseVectorValues(&log_options, "Small values in matrix", num_values,
                      this->value_, false, "");
}